

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invent.c
# Opt level: O0

char display_pickinv(char *lets,boolean want_reply,long *out_cnt)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  size_t sVar5;
  char *pcVar6;
  nh_objitem *items_00;
  char local_d8 [8];
  char titlebuf [128];
  char *title;
  nh_objresult *selected;
  nh_objitem *items;
  int local_38;
  int icount;
  int n;
  char ret;
  obj *otmp;
  long *out_cnt_local;
  char *pcStack_18;
  boolean want_reply_local;
  char *lets_local;
  
  local_38 = 0;
  items._4_4_ = 0;
  title = (char *)0x0;
  otmp = (obj *)out_cnt;
  out_cnt_local._7_1_ = want_reply;
  pcStack_18 = lets;
  if ((invent == (obj *)0x0) && ((lets != (char *)0x0 || (want_reply != '\0')))) {
    pline("Not carrying anything.");
    lets_local._7_1_ = '\0';
  }
  else if ((lets == (char *)0x0) || (sVar5 = strlen(lets), sVar5 != 1)) {
    items_00 = make_invlist(pcStack_18,(int *)((long)&items + 4));
    if (items._4_4_ != 0) {
      if (out_cnt_local._7_1_ == '\0') {
        iVar1 = weight_cap();
        iVar2 = inv_weight();
        uVar3 = weight_cap();
        uVar4 = inv_cnt();
        snprintf(local_d8,0x80,"Inventory: %d/%dwt (%d of 52 slots)",(ulong)(uint)(iVar1 + iVar2),
                 (ulong)uVar3,(ulong)uVar4);
        titlebuf._120_8_ = local_d8;
      }
      else {
        titlebuf[0x78] = '\0';
        titlebuf[0x79] = '\0';
        titlebuf[0x7a] = '\0';
        titlebuf[0x7b] = '\0';
        titlebuf[0x7c] = '\0';
        titlebuf[0x7d] = '\0';
        titlebuf[0x7e] = '\0';
        titlebuf[0x7f] = '\0';
      }
      title = (char *)malloc((long)items._4_4_ << 3);
      iVar1 = -1;
      if (out_cnt_local._7_1_ != '\0') {
        iVar1 = 1;
      }
      local_38 = display_objects(items_00,items._4_4_,(char *)titlebuf._120_8_,iVar1,
                                 (nh_objresult *)title);
    }
    if (local_38 < 1) {
      icount._3_1_ = '\x1b';
      if (local_38 == 0) {
        icount._3_1_ = '\0';
      }
    }
    else {
      icount._3_1_ = (char)*(undefined4 *)title;
      if (otmp != (obj *)0x0) {
        otmp->nobj = (obj *)(long)*(int *)(title + 4);
      }
    }
    free(title);
    free(items_00);
    lets_local._7_1_ = icount._3_1_;
  }
  else {
    icount._3_1_ = '\0';
    for (_n = invent; _n != (obj *)0x0; _n = _n->nobj) {
      if (_n->invlet == *pcStack_18) {
        pcVar6 = xprname(_n,(char *)0x0,*pcStack_18,'\x01',0,0);
        pline("%s",pcVar6);
        if (otmp != (obj *)0x0) {
          otmp->nobj = (obj *)0xffffffffffffffff;
        }
        break;
      }
    }
    lets_local._7_1_ = icount._3_1_;
  }
  return lets_local._7_1_;
}

Assistant:

static char display_pickinv(const char *lets, boolean want_reply, long *out_cnt)
{
	struct obj *otmp;
	char ret;
	int n = 0;
	int icount = 0;
	struct nh_objitem *items;
	struct nh_objresult *selected = NULL;

	/*
	Exit early if no inventory -- but keep going if we are doing
	a permanent inventory update.  We need to keep going so the
	permanent inventory window updates itself to remove the last
	item(s) dropped.  One down side:  the addition of the exception
	for permanent inventory window updates _can_ pop the window
	up when it's not displayed -- even if it's empty -- because we
	don't know at this level if its up or not.  This may not be
	an issue if empty checks are done before hand and the call
	to here is short circuited away.
	*/
	if (!invent && !(!lets && !want_reply)) {
	    pline("Not carrying anything.");
	    return 0;
	}

	if (lets && strlen(lets) == 1) {
	    /* when only one item of interest, use pline instead of menus */
	    ret = '\0';
	    for (otmp = invent; otmp; otmp = otmp->nobj) {
		if (otmp->invlet == lets[0]) {
		    pline("%s", xprname(otmp, NULL, lets[0], TRUE, 0L, 0L));
		    if (out_cnt) *out_cnt = -1L;	/* select all */
		    break;
		}
	    }
	    return ret;
	}

	items = make_invlist(lets, &icount);

	if (icount) {
	    char *title;
	    char titlebuf[QBUFSZ];
	    if (want_reply) {
		title = NULL;
	    } else {
		snprintf(titlebuf, QBUFSZ, "Inventory: %d/%dwt (%d of 52 slots)",
			 weight_cap() + inv_weight(), weight_cap(), inv_cnt());
		title = titlebuf;
	    }
	    selected = malloc(icount * sizeof(struct nh_objresult));
	    n = display_objects(items, icount, title,
				want_reply ? PICK_ONE : PICK_INVACTION, selected);
	}
	if (n > 0) {
	    ret = (char)selected[0].id;
	    if (out_cnt)
		*out_cnt = selected[0].count;
	} else
	    ret = !n ? '\0' : '\033';	/* cancelled */
	    
	free(selected);
	free(items);
	return ret;
}